

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

void __thiscall Matrix::Matrix(Matrix *this,Matrix *m)

{
  pointer pcVar1;
  
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_0015d708;
  (this->matrixParent).px = (double *)0x0;
  (this->matrixParent).pn.pi_ = (sp_counted_base *)0x0;
  (this->sMatrixName)._M_dataplus._M_p = (pointer)&(this->sMatrixName).field_2;
  pcVar1 = (m->sMatrixName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->sMatrixName,pcVar1,pcVar1 + (m->sMatrixName)._M_string_length);
  copy(this,(EVP_PKEY_CTX *)m,(EVP_PKEY_CTX *)0x1);
  return;
}

Assistant:

Matrix::Matrix( const Matrix &m ) : sMatrixName( m.sMatrixName )
{
	// do a shallow copy so we don't shift memory each time a fcn returns a matrix
    copy( m, true );
}